

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *workspace,size_t workspaceSize)

{
  uint uVar1;
  uint uVar2;
  void *code;
  size_t errcod_3;
  size_t NCountSize;
  size_t errcod_2;
  size_t sStack_d0;
  U32 tableLog;
  size_t nbSeq_1;
  S16 norm [53];
  size_t errcod_1;
  size_t errcod;
  BYTE *oend;
  BYTE *op;
  uint *count_local;
  symbolEncodingType_e type_local;
  U32 FSELog_local;
  FSE_CTable *nextCTable_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  switch(type) {
  case set_basic:
    register0x00000000 =
         (void *)FSE_buildCTable_wksp
                           (nextCTable,defaultNorm,defaultMax,defaultNormLog,workspace,workspaceSize
                           );
    uVar1 = ERR_isError((size_t)register0x00000000);
    if (uVar1 == 0) {
      dst_local = (void *)0x0;
    }
    else {
      dst_local = stack0xffffffffffffffa8;
    }
    break;
  case set_rle:
    dst_local = (void *)FSE_buildCTable_rle(nextCTable,(BYTE)max);
    uVar1 = ERR_isError((size_t)dst_local);
    if (uVar1 == 0) {
      if (dstCapacity == 0) {
        dst_local = (void *)0xffffffffffffffba;
      }
      else {
        *(BYTE *)dst = *codeTable;
        dst_local = (void *)0x1;
      }
    }
    break;
  case set_compressed:
    sStack_d0 = nbSeq;
    uVar1 = FSE_optimalTableLog(FSELog,nbSeq,max);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      sStack_d0 = nbSeq - 1;
    }
    dst_local = (void *)FSE_normalizeCount((short *)&nbSeq_1,uVar1,count,sStack_d0,max);
    uVar2 = ERR_isError((size_t)dst_local);
    if (uVar2 == 0) {
      dst_local = (void *)FSE_writeNCount(dst,dstCapacity,(short *)&nbSeq_1,max,uVar1);
      uVar2 = ERR_isError((size_t)dst_local);
      if (uVar2 == 0) {
        code = (void *)FSE_buildCTable_wksp
                                 (nextCTable,(short *)&nbSeq_1,max,uVar1,workspace,workspaceSize);
        uVar1 = ERR_isError((size_t)code);
        if (uVar1 != 0) {
          dst_local = code;
        }
      }
    }
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    dst_local = (void *)0x0;
    break;
  default:
    dst_local = (void *)0xffffffffffffffff;
  }
  return (size_t)dst_local;
}

Assistant:

MEM_STATIC size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        CHECK_F(FSE_buildCTable_rle(nextCTable, (BYTE)max));
        if (dstCapacity==0) return ERROR(dstSize_tooSmall);
        *op = codeTable[0];
        return 1;
    case set_repeat:
        memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        CHECK_F(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, workspace, workspaceSize));  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        S16 norm[MaxSeq + 1];
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        CHECK_F(FSE_normalizeCount(norm, tableLog, count, nbSeq_1, max));
        {   size_t const NCountSize = FSE_writeNCount(op, oend - op, norm, max, tableLog);   /* overflow protected */
            if (FSE_isError(NCountSize)) return NCountSize;
            CHECK_F(FSE_buildCTable_wksp(nextCTable, norm, max, tableLog, workspace, workspaceSize));
            return NCountSize;
        }
    }
    default: return assert(0), ERROR(GENERIC);
    }
}